

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float64_squash_input_denormal_mips(float64 a,float_status *status)

{
  _Bool _Var1;
  FloatParts p_00;
  FloatParts p;
  float_status *status_local;
  float64 a_local;
  
  a_local = a;
  if (status->flush_inputs_to_zero != '\0') {
    p_00 = float64_unpack_raw(a);
    _Var1 = parts_squash_denormal(p_00,status);
    if (_Var1) {
      p.frac._5_1_ = p_00.sign;
      a_local = float64_set_sign(0,p.frac._5_1_ & 1);
    }
  }
  return a_local;
}

Assistant:

float64 float64_squash_input_denormal(float64 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float64_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float64_set_sign(float64_zero, p.sign);
        }
    }
    return a;
}